

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlRegisterErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_38;
  PyObject *pyobj_ctx;
  PyObject *pyobj_f;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OO:xmlRegisterErrorHandler",&pyobj_ctx,&local_38);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (libxml_xmlPythonErrorFuncHandler != (PyObject *)0x0) {
      _Py_XDECREF(libxml_xmlPythonErrorFuncHandler);
    }
    if (libxml_xmlPythonErrorFuncCtxt != (PyObject *)0x0) {
      _Py_XDECREF(libxml_xmlPythonErrorFuncCtxt);
    }
    _Py_XINCREF(local_38);
    _Py_XINCREF(pyobj_ctx);
    libxml_xmlPythonErrorFuncHandler = pyobj_ctx;
    libxml_xmlPythonErrorFuncCtxt = local_38;
    self_local = libxml_intWrap(1);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlRegisterErrorHandler(ATTRIBUTE_UNUSED PyObject * self,
                               PyObject * args)
{
    PyObject *py_retval;
    PyObject *pyobj_f;
    PyObject *pyobj_ctx;

    if (!PyArg_ParseTuple
        (args, (char *) "OO:xmlRegisterErrorHandler", &pyobj_f,
         &pyobj_ctx))
        return (NULL);

#ifdef DEBUG_ERROR
    printf("libxml_xmlRegisterErrorHandler(%p, %p) called\n", pyobj_ctx,
           pyobj_f);
#endif

    if (libxml_xmlPythonErrorFuncHandler != NULL) {
        Py_XDECREF(libxml_xmlPythonErrorFuncHandler);
    }
    if (libxml_xmlPythonErrorFuncCtxt != NULL) {
        Py_XDECREF(libxml_xmlPythonErrorFuncCtxt);
    }

    Py_XINCREF(pyobj_ctx);
    Py_XINCREF(pyobj_f);

    /* TODO: check f is a function ! */
    libxml_xmlPythonErrorFuncHandler = pyobj_f;
    libxml_xmlPythonErrorFuncCtxt = pyobj_ctx;

    py_retval = libxml_intWrap(1);
    return (py_retval);
}